

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::LeavingCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  RuntimeThreadData **threadData;
  JsValueRef pvStack_40;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_30;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  pvStack_40 = (JsValueRef)0x0;
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  JVar1 = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffc0);
  if (((JVar1 == JsNoError) && (callbackState_local._6_2_ != 0)) &&
     (pRVar2 = GetRuntimeThreadLocalData(), pRVar2->threadData != (RuntimeThreadData *)0x0)) {
    pRVar2->threadData->leaving = true;
  }
  return pvStack_40;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::LeavingCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 0)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            threadData->leaving = true;
        }
    }

Error:
    return returnValue;
}